

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aho-corasick-lite.cpp
# Opt level: O0

bool __thiscall Trie::buildClue(Trie *this)

{
  bool bVar1;
  _Rb_tree_iterator<std::pair<const_unsigned_short,_trie_node_s_*>_> *this_00;
  pointer ppVar2;
  iterator this_01;
  long in_RDI;
  trie_node_t *child;
  trie_node_t *out;
  trie_node_t *clue;
  int tail;
  int head;
  int i;
  iterator iter;
  queue<trie_node_s_*,_std::deque<trie_node_s_*,_std::allocator<trie_node_s_*>_>_> Queue;
  map<unsigned_short,_trie_node_s_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_trie_node_s_*>_>_>
  *in_stack_fffffffffffffef8;
  iterator in_stack_ffffffffffffff00;
  undefined6 in_stack_ffffffffffffff38;
  _Self local_b0;
  _Self local_a8;
  _Base_ptr local_a0;
  trie_node_s *local_88;
  value_type local_80;
  trie_node_t *local_78;
  undefined4 local_6c;
  undefined4 local_68;
  uint local_64;
  _Self local_60 [12];
  
  std::queue<trie_node_s*,std::deque<trie_node_s*,std::allocator<trie_node_s*>>>::
  queue<std::deque<trie_node_s*,std::allocator<trie_node_s*>>,void>
            ((queue<trie_node_s_*,_std::deque<trie_node_s_*,_std::allocator<trie_node_s_*>_>_> *)
             in_stack_ffffffffffffff00._M_node);
  local_60[0]._M_node =
       (_Base_ptr)
       std::
       map<unsigned_short,_trie_node_s_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_trie_node_s_*>_>_>
       ::begin(in_stack_fffffffffffffef8);
  local_68 = 0;
  local_6c = 0;
  local_78 = *(trie_node_t **)(in_RDI + 0x38);
  std::queue<trie_node_s_*,_std::deque<trie_node_s_*,_std::allocator<trie_node_s_*>_>_>::push
            ((queue<trie_node_s_*,_std::deque<trie_node_s_*,_std::allocator<trie_node_s_*>_>_> *)
             in_stack_ffffffffffffff00._M_node,(value_type *)in_stack_fffffffffffffef8);
  do {
    do {
      bVar1 = std::queue<trie_node_s_*,_std::deque<trie_node_s_*,_std::allocator<trie_node_s_*>_>_>
              ::empty((queue<trie_node_s_*,_std::deque<trie_node_s_*,_std::allocator<trie_node_s_*>_>_>
                       *)0x11635e);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        std::queue<trie_node_s_*,_std::deque<trie_node_s_*,_std::allocator<trie_node_s_*>_>_>::
        ~queue((queue<trie_node_s_*,_std::deque<trie_node_s_*,_std::allocator<trie_node_s_*>_>_> *)
               0x1165de);
        return true;
      }
      this_00 = (_Rb_tree_iterator<std::pair<const_unsigned_short,_trie_node_s_*>_> *)
                std::
                queue<trie_node_s_*,_std::deque<trie_node_s_*,_std::allocator<trie_node_s_*>_>_>::
                front((queue<trie_node_s_*,_std::deque<trie_node_s_*,_std::allocator<trie_node_s_*>_>_>
                       *)0x116380);
      local_80 = (value_type)this_00->_M_node;
      std::queue<trie_node_s_*,_std::deque<trie_node_s_*,_std::allocator<trie_node_s_*>_>_>::pop
                ((queue<trie_node_s_*,_std::deque<trie_node_s_*,_std::allocator<trie_node_s_*>_>_> *
                 )0x1163a4);
      bVar1 = std::
              map<unsigned_short,_trie_node_s_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_trie_node_s_*>_>_>
              ::empty((map<unsigned_short,_trie_node_s_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_trie_node_s_*>_>_>
                       *)0x1163b7);
    } while (bVar1);
    local_a0 = (_Base_ptr)
               std::
               map<unsigned_short,_trie_node_s_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_trie_node_s_*>_>_>
               ::begin(in_stack_fffffffffffffef8);
    local_60[0]._M_node = local_a0;
    while( true ) {
      local_a8._M_node =
           (_Base_ptr)
           std::
           map<unsigned_short,_trie_node_s_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_trie_node_s_*>_>_>
           ::end(in_stack_fffffffffffffef8);
      bVar1 = std::operator!=(local_60,&local_a8);
      if (!bVar1) break;
      ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_short,_trie_node_s_*>_>::operator->
                         ((_Rb_tree_iterator<std::pair<const_unsigned_short,_trie_node_s_*>_> *)
                          0x116440);
      local_88 = ppVar2->second;
      if (local_88 != (trie_node_s *)0x0) {
        std::queue<trie_node_s_*,_std::deque<trie_node_s_*,_std::allocator<trie_node_s_*>_>_>::push
                  ((queue<trie_node_s_*,_std::deque<trie_node_s_*,_std::allocator<trie_node_s_*>_>_>
                    *)in_stack_ffffffffffffff00._M_node,(value_type *)in_stack_fffffffffffffef8);
        if (local_80 == *(value_type *)(in_RDI + 0x38)) {
          local_88->search_clue = *(trie_node_t **)(in_RDI + 0x38);
        }
        else {
          local_78 = local_80->search_clue;
          ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_short,_trie_node_s_*>_>::
                   operator->((_Rb_tree_iterator<std::pair<const_unsigned_short,_trie_node_s_*>_> *)
                              0x1164c0);
          local_64 = (uint)ppVar2->first;
          for (; local_78 != (trie_node_t *)0x0; local_78 = local_78->search_clue) {
            in_stack_ffffffffffffff00 =
                 std::
                 map<unsigned_short,_trie_node_s_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_trie_node_s_*>_>_>
                 ::find(in_stack_fffffffffffffef8,(key_type *)0x1164fc);
            local_b0._M_node = in_stack_ffffffffffffff00._M_node;
            this_01 = std::
                      map<unsigned_short,_trie_node_s_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_trie_node_s_*>_>_>
                      ::end(in_stack_fffffffffffffef8);
            bVar1 = std::operator!=(&local_b0,(_Self *)&stack0xffffffffffffff40);
            if (bVar1) {
              in_stack_fffffffffffffef8 =
                   (map<unsigned_short,_trie_node_s_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_trie_node_s_*>_>_>
                    *)std::
                      map<unsigned_short,_trie_node_s_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_trie_node_s_*>_>_>
                      ::operator[]((map<unsigned_short,_trie_node_s_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_trie_node_s_*>_>_>
                                    *)this_01._M_node,
                                   (key_type *)
                                   CONCAT26((undefined2)local_64,in_stack_ffffffffffffff38));
              local_88->search_clue = *(trie_node_t **)&(in_stack_fffffffffffffef8->_M_t)._M_impl;
              break;
            }
          }
          if (local_78 == (trie_node_t *)0x0) {
            local_88->search_clue = *(trie_node_t **)(in_RDI + 0x38);
          }
        }
      }
      std::_Rb_tree_iterator<std::pair<const_unsigned_short,_trie_node_s_*>_>::operator++
                (this_00,(int)((ulong)in_stack_ffffffffffffff00._M_node >> 0x20));
    }
  } while( true );
}

Assistant:

bool Trie::buildClue()
{
	queue<trie_node_t*> Queue;
	auto iter = root->nextMap.begin();
	int i, head = 0, tail = 0;
	trie_node_t *clue = root, *out, *child;
	Queue.push(root);
	while ( ! Queue.empty() ) {
		out = Queue.front();
		Queue.pop();
		if (out->nextMap.empty()) {
			continue;
		}
		for (iter = out->nextMap.begin(); iter != out->nextMap.end(); iter++) {
			child = iter->second;
			if (child != NULL) {
				Queue.push(child);
				if (out == root) {
					child->search_clue = root;
					continue;
				}
				clue = out->search_clue;
				i = iter->first;
				while (clue) {
					if (clue->nextMap.find(i) != clue->nextMap.end()) {
						child->search_clue = clue->nextMap[i];
						break;
					}
					clue = clue->search_clue;
				}
				if (clue == NULL) {
					child->search_clue = root;
				}
			}
		}
	}
	return true;
}